

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O2

c_int * csc_pinv(c_int *p,c_int n)

{
  c_int *pcVar1;
  long lVar2;
  
  if (p != (c_int *)0x0) {
    pcVar1 = (c_int *)malloc(n * 8);
    if (pcVar1 == (c_int *)0x0) {
      pcVar1 = (c_int *)0x0;
    }
    else {
      lVar2 = 0;
      if (n < 1) {
        n = lVar2;
      }
      for (; n != lVar2; lVar2 = lVar2 + 1) {
        pcVar1[p[lVar2]] = lVar2;
      }
    }
    return pcVar1;
  }
  return (c_int *)0x0;
}

Assistant:

c_int* csc_pinv(c_int const *p, c_int n) {
  c_int k, *pinv;

  if (!p) return OSQP_NULL;                /* p = OSQP_NULL denotes identity */

  pinv = csc_malloc(n, sizeof(c_int));     /* allocate result */

  if (!pinv) return OSQP_NULL;             /* out of memory */

  for (k = 0; k < n; k++) pinv[p[k]] = k;  /* invert the permutation */
  return pinv;                             /* return result */
}